

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_huffman.cpp
# Opt level: O3

void build_code(HuffmanTree *huffmanTree,node n,int len,unsigned_long out1,unsigned_long out2)

{
  uint uVar1;
  unsigned_long *puVar2;
  uchar uVar3;
  ulong out2_00;
  
  if (n->t == '\0') {
    do {
      while (uVar1 = len, uVar1 < 0x40) {
        build_code(huffmanTree,n->left,uVar1 + 1,out1 * 2,0);
        out1 = out1 * 2 + 1;
        n = n->right;
        out2 = 0;
        len = uVar1 + 1;
        if (n->t != '\0') {
          out2 = 0;
          goto LAB_00107e28;
        }
      }
      out2_00 = out2 << ((uVar1 & 0x3f) != 0);
      build_code(huffmanTree,n->left,uVar1 + 1,out1,out2_00);
      out2 = out2_00 | 1;
      n = n->right;
      len = uVar1 + 1;
    } while (n->t == '\0');
LAB_00107e28:
    len = uVar1 + 1;
  }
  puVar2 = (unsigned_long *)malloc(0x10);
  uVar1 = n->c;
  huffmanTree->code[uVar1] = puVar2;
  uVar3 = (uchar)len;
  if (len < 0x41) {
    puVar2 = huffmanTree->code[uVar1];
    *puVar2 = out1 << (-uVar3 & 0x3f);
  }
  else {
    puVar2 = huffmanTree->code[uVar1];
    *puVar2 = out1;
    out2 = out2 << (-uVar3 & 0x3f);
  }
  puVar2[1] = out2;
  huffmanTree->cout[uVar1] = uVar3;
  return;
}

Assistant:

void build_code(HuffmanTree *huffmanTree, node n, int len, unsigned long out1, unsigned long out2)
{
	if (n->t) {
		huffmanTree->code[n->c] = (unsigned long*)malloc(2*sizeof(unsigned long));
		if(len<=64)
		{
			(huffmanTree->code[n->c])[0] = out1 << (64 - len);
			(huffmanTree->code[n->c])[1] = out2;
		}
		else
		{
			(huffmanTree->code[n->c])[0] = out1;
			(huffmanTree->code[n->c])[1] = out2 << (128 - len);
		}
		huffmanTree->cout[n->c] = (unsigned char)len;
		return;
	}
	int index = len >> 6; //=len/64
	if(index == 0)
	{
		out1 = out1 << 1;
		out1 = out1 | 0;
		build_code(huffmanTree, n->left, len + 1, out1, 0);
		out1 = out1 | 1;
		build_code(huffmanTree, n->right, len + 1, out1, 0);		
	}
	else
	{
		if(len%64!=0)
			out2 = out2 << 1;
		out2 = out2 | 0;
		build_code(huffmanTree, n->left, len + 1, out1, out2);
		out2 = out2 | 1;
		build_code(huffmanTree, n->right, len + 1, out1, out2);	
	}
}